

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
EfcFlash::getLockRegions(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,EfcFlash *this)

{
  uint in_EAX;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t region;
  ulong __n;
  uint uVar3;
  uint uVar4;
  reference rVar5;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(ulong)(this->super_Flash)._lockRegions,
             (allocator_type *)((long)&uStack_38 + 3));
  uVar1 = readFSR0(this);
  uStack_38 = (ulong)(uint)uStack_38;
  if ((this->super_Flash)._planes == 2) {
    uVar2 = readFSR1(this);
    uStack_38 = CONCAT44(uVar2,(uint)uStack_38);
  }
  uVar3 = 0x10;
  __n = 0;
  do {
    uVar4 = (this->super_Flash)._lockRegions;
    if (uVar4 <= __n) {
      return __return_storage_ptr__;
    }
    if (((this->super_Flash)._planes == 2) && (uVar4 = uVar4 >> 1, uVar4 <= __n)) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](__return_storage_ptr__,__n);
      if ((uStack_38._4_4_ >> (uVar3 - uVar4 & 0x1f) & 1) == 0) goto LAB_0010d5b8;
LAB_0010d599:
      *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
    }
    else {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](__return_storage_ptr__,__n);
      if ((uVar1 >> (uVar3 & 0x1f) & 1) != 0) goto LAB_0010d599;
LAB_0010d5b8:
      *rVar5._M_p = *rVar5._M_p & ~rVar5._M_mask;
    }
    __n = __n + 1;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::vector<bool>
EfcFlash::getLockRegions()
{
    std::vector<bool> regions(_lockRegions);
    uint32_t fsr0;
    uint32_t fsr1;

    fsr0 = readFSR0();
    if (_planes == 2)
        fsr1 = readFSR1();
    else
        fsr1 = 0;

    for (uint32_t region = 0; region < _lockRegions; region++)
    {
        if (_planes == 2 && region >= _lockRegions / 2)
            regions[region] = (fsr1 & (1 << (16 + region - _lockRegions / 2))) != 0;
        else
            regions[region] = (fsr0 & (1 << (16 + region))) != 0;
    }

    return regions;
}